

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O3

void __thiscall embree::InstanceArray::~InstanceArray(InstanceArray *this)

{
  size_t *psVar1;
  long *plVar2;
  Device *pDVar3;
  Buffer *pBVar4;
  uint uVar5;
  Accel **ppAVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__InstanceArray_02186688;
  plVar2 = *(long **)&(this->super_Geometry).field_0x58;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x18))();
  }
  ppAVar6 = this->objects;
  if (ppAVar6 != (Accel **)0x0) {
    uVar5 = this->numObjects;
    if (uVar5 != 0) {
      uVar8 = 0;
      do {
        if (this->objects[uVar8] != (Accel *)0x0) {
          (*(this->objects[uVar8]->super_AccelData).super_RefCount._vptr_RefCount[3])();
          uVar5 = this->numObjects;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar5);
      ppAVar6 = this->objects;
    }
    pDVar3 = (this->super_Geometry).device;
    (*(pDVar3->super_State).super_RefCount._vptr_RefCount[9])(pDVar3,ppAVar6);
  }
  pDVar3 = (this->super_Geometry).device;
  (*(pDVar3->super_State).super_RefCount._vptr_RefCount[4])(pDVar3,0xffffffffffffff30,0);
  pBVar4 = (this->object_ids).super_RawBufferView.buffer.ptr;
  if (pBVar4 != (Buffer *)0x0) {
    (*(pBVar4->super_RefCount)._vptr_RefCount[3])();
  }
  psVar1 = &(this->l2w_buf).size_active;
  uVar8 = (this->l2w_buf).size_active;
  if (uVar8 != 0) {
    lVar9 = 0x30;
    uVar7 = 0;
    do {
      plVar2 = *(long **)((long)&((this->l2w_buf).items)->ptr_ofs + lVar9);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x18))();
        uVar8 = *psVar1;
      }
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x38;
    } while (uVar7 < uVar8);
  }
  pDVar3 = (this->l2w_buf).alloc.device;
  if (pDVar3 != (Device *)0x0) {
    (*(pDVar3->super_State).super_RefCount._vptr_RefCount[9])(pDVar3,(this->l2w_buf).items);
  }
  *psVar1 = 0;
  (this->l2w_buf).size_alloced = 0;
  (this->l2w_buf).items = (RawBufferView *)0x0;
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

InstanceArray::~InstanceArray()
  {
    if (object) object->refDec();
    if (objects) {
      for (size_t i = 0; i < numObjects; ++i) {
        if (objects[i]) objects[i]->refDec();
      }
      device->free(objects);
    }
    device->memoryMonitor(-sizeof(*this), false);
  }